

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2SharingThreadedTests.cpp
# Opt level: O0

void __thiscall
deqp::egl::GLES2ThreadTest::BufferSubData::BufferSubData
          (BufferSubData *this,SharedPtr<deqp::egl::GLES2ThreadTest::Buffer> *buffer,GLenum target,
          GLintptr offset,GLsizeiptr size,bool useSync,bool serverSync)

{
  SharedPtr<deqp::egl::GLES2ThreadTest::Object> local_58 [2];
  undefined1 local_32;
  undefined1 local_31;
  bool serverSync_local;
  GLsizeiptr GStack_30;
  bool useSync_local;
  GLsizeiptr size_local;
  GLintptr offset_local;
  SharedPtr<deqp::egl::GLES2ThreadTest::Buffer> *pSStack_18;
  GLenum target_local;
  SharedPtr<deqp::egl::GLES2ThreadTest::Buffer> *buffer_local;
  BufferSubData *this_local;
  
  local_32 = serverSync;
  local_31 = useSync;
  GStack_30 = size;
  size_local = offset;
  offset_local._4_4_ = target;
  pSStack_18 = buffer;
  buffer_local = (SharedPtr<deqp::egl::GLES2ThreadTest::Buffer> *)this;
  Operation::Operation(&this->super_Operation,"BufferSubData",useSync,serverSync);
  (this->super_Operation).super_Operation._vptr_Operation =
       (_func_int **)&PTR__BufferSubData_032777b8;
  de::SharedPtr<deqp::egl::GLES2ThreadTest::Buffer>::SharedPtr(&this->m_buffer,buffer);
  this->m_target = offset_local._4_4_;
  this->m_offset = size_local;
  this->m_size = GStack_30;
  de::SharedPtr<deqp::egl::GLES2ThreadTest::Object>::SharedPtr<deqp::egl::GLES2ThreadTest::Buffer>
            (local_58,&this->m_buffer);
  Operation::modifyGLObject(&this->super_Operation,local_58);
  de::SharedPtr<deqp::egl::GLES2ThreadTest::Object>::~SharedPtr(local_58);
  return;
}

Assistant:

BufferSubData::BufferSubData (SharedPtr<Buffer> buffer, GLenum target, GLintptr offset, GLsizeiptr size, bool useSync, bool serverSync)
	: Operation	("BufferSubData", useSync, serverSync)
	, m_buffer	(buffer)
	, m_target	(target)
	, m_offset	(offset)
	, m_size	(size)
{
	modifyGLObject(SharedPtr<Object>(m_buffer));
}